

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void printReads(ostream *outfile,deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads
               ,int doc_haplotypes)

{
  int iVar1;
  _Elt_pointer ppAVar2;
  pointer pbVar3;
  ulong uVar4;
  difference_type dVar5;
  ostream *poVar6;
  long lVar7;
  AlignmentRecord **r;
  _Elt_pointer ppAVar8;
  _Elt_pointer ppAVar9;
  AlignmentRecord *pAVar10;
  char *pcVar11;
  int iVar12;
  AlignmentRecord **r_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar13;
  uint uVar14;
  int iVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  int iVar16;
  int iVar17;
  _Elt_pointer local_1b0;
  _Map_pointer local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  _Map_pointer local_170;
  _Elt_pointer local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  _Map_pointer pppAStack_140;
  _Self local_138;
  _Self local_118;
  _Self local_f8;
  _Self local_d8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  _Map_pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  _Map_pointer local_78;
  _Self local_70;
  _Self local_50;
  
  local_118._M_cur =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_118._M_first =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_118._M_last =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_118._M_node =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_138._M_cur =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_138._M_first =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_138._M_last =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_138._M_node =
       (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  if (local_118._M_cur != local_138._M_cur) {
    local_b0 = (pointer)local_138._M_cur;
    local_a8 = (pointer)local_138._M_first;
    local_a0 = (pointer)local_138._M_last;
    local_98 = local_138._M_node;
    local_90 = (pointer)local_118._M_cur;
    local_88 = (pointer)local_118._M_first;
    local_80 = (pointer)local_118._M_last;
    local_78 = local_118._M_node;
    uVar4 = std::operator-(&local_138,&local_118);
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,long,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
              (&local_90,&local_b0,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    local_d8._M_cur = local_118._M_cur;
    local_d8._M_first = local_118._M_first;
    local_d8._M_last = local_118._M_last;
    local_d8._M_node = local_118._M_node;
    local_f8._M_cur = local_138._M_cur;
    local_f8._M_first = local_138._M_first;
    local_f8._M_last = local_138._M_last;
    local_f8._M_node = local_138._M_node;
    dVar5 = std::operator-(&local_f8,&local_d8);
    if (dVar5 < 0x11) {
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._M_cur;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_first;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._M_last;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._M_cur;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._M_first;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._M_last;
      pppAStack_140 = local_f8._M_node;
      std::
      __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                ();
    }
    else {
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._M_cur;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._M_first;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._M_last;
      pppAStack_140 = local_d8._M_node;
      std::operator+(&local_50,&local_d8,0x10);
      std::
      __insertion_sort<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Iter_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                (&local_158,&local_50);
      std::operator+(&local_70,&local_d8,0x10);
      ppAVar9 = local_f8._M_cur;
      while (local_70._M_cur != ppAVar9) {
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_70._M_cur;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_70._M_first;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_70._M_last;
        std::
        __unguarded_linear_insert<std::_Deque_iterator<AlignmentRecord*,AlignmentRecord*&,AlignmentRecord**>,__gnu_cxx::__ops::_Val_comp_iter<printReads(std::ostream&,std::deque<AlignmentRecord*,std::allocator<AlignmentRecord*>>&,int)::__0>>
                  (&names);
        local_70._M_cur = (_Elt_pointer)&((pointer)local_70._M_cur)->_M_string_length;
        if (local_70._M_cur == local_70._M_last) {
          local_70._M_cur = local_70._M_node[1];
          local_70._M_node = local_70._M_node + 1;
          local_70._M_last = (_Elt_pointer)((long)local_70._M_cur + 0x200);
          local_70._M_first = local_70._M_cur;
        }
      }
    }
  }
  lVar7 = *(long *)outfile;
  *(undefined8 *)(outfile + *(long *)(lVar7 + -0x18) + 8) = 5;
  lVar7 = *(long *)(lVar7 + -0x18);
  *(uint *)(outfile + lVar7 + 0x18) = *(uint *)(outfile + lVar7 + 0x18) & 0xfffffefb | 4;
  if (doc_haplotypes == 5) {
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppAVar9 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_168 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
    local_170 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    ppAVar8 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (ppAVar9 != ppAVar8) {
      AlignmentRecord::getReadNames_abi_cxx11_(&local_158,*ppAVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&names,&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      poVar6 = std::operator<<(outfile,">");
      std::operator<<(poVar6,(string *)*ppAVar9);
      pAVar10 = *ppAVar9;
      if (pAVar10->single_end == true) {
        std::operator<<(outfile,"|ht_freq:");
        std::ostream::_M_insert<double>((*ppAVar9)->probability);
        poVar6 = std::operator<<(outfile,"|start1:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(outfile,"|end1:");
LAB_0018fe90:
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      }
      else {
        uVar14 = pAVar10->end1 + 1;
        if (uVar14 < pAVar10->start2) {
          std::operator<<(outfile,"|paired");
          std::operator<<(outfile,"|ht_freq:");
          std::ostream::_M_insert<double>((*ppAVar9)->probability);
          poVar6 = std::operator<<(outfile,"|start1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(outfile,"|end1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(outfile,"|start2:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar11 = "|end2:";
LAB_0018fe83:
          poVar6 = std::operator<<(outfile,pcVar11);
          goto LAB_0018fe90;
        }
        if (uVar14 == pAVar10->start2) {
          std::operator<<(outfile,"|ht_freq:");
          std::ostream::_M_insert<double>((*ppAVar9)->probability);
          poVar6 = std::operator<<(outfile,"|start1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar11 = "|end1:";
          goto LAB_0018fe83;
        }
      }
      pbVar3 = names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar15 = 0;
      iVar16 = 0;
      iVar1 = 0;
      iVar12 = 0;
      iVar17 = 0;
      for (pbVar13 = names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b0569);
        if (lVar7 == -1) {
          lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b0571);
          if (lVar7 == -1) {
            lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b0579);
            if (lVar7 == -1) {
              lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b0581);
              if (lVar7 == -1) {
                lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b0589);
                iVar1 = iVar1 + (uint)(lVar7 != -1);
              }
              else {
                iVar16 = iVar16 + 1;
              }
            }
            else {
              iVar15 = iVar15 + 1;
            }
          }
          else {
            iVar12 = iVar12 + 1;
          }
        }
        else {
          iVar17 = iVar17 + 1;
        }
      }
      poVar6 = std::operator<<(outfile,"|ht1:");
      std::ostream::operator<<((ostream *)poVar6,iVar17);
      poVar6 = std::operator<<(outfile,"|ht2:");
      std::ostream::operator<<((ostream *)poVar6,iVar12);
      poVar6 = std::operator<<(outfile,"|ht3:");
      std::ostream::operator<<((ostream *)poVar6,iVar15);
      poVar6 = std::operator<<(outfile,"|ht4:");
      std::ostream::operator<<((ostream *)poVar6,iVar16);
      poVar6 = std::operator<<(outfile,"|ht5:");
      std::ostream::operator<<((ostream *)poVar6,iVar1);
      std::endl<char,std::char_traits<char>>(outfile);
      operator<<(outfile,&(*ppAVar9)->sequence1);
      if ((*ppAVar9)->single_end == false) {
        uVar14 = (*ppAVar9)->end1;
        while( true ) {
          uVar14 = uVar14 + 1;
          if ((*ppAVar9)->start2 <= uVar14) break;
          std::operator<<(outfile,"N");
        }
        operator<<(outfile,&(*ppAVar9)->sequence2);
      }
      std::endl<char,std::char_traits<char>>(outfile);
      ppAVar9 = ppAVar9 + 1;
      if (ppAVar9 == local_168) {
        ppAVar9 = local_170[1];
        local_170 = local_170 + 1;
        local_168 = ppAVar9 + 0x40;
      }
    }
  }
  else {
    if (doc_haplotypes != 2) {
      if (doc_haplotypes != 0) {
        return;
      }
      ppAVar8 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppAVar9 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_1b0 = (_Elt_pointer)
                  (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      ppAVar2 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppAVar8 != ppAVar2) {
        AlignmentRecord::getReadNames_abi_cxx11_(&names,*ppAVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&names);
        poVar6 = std::operator<<(outfile,">");
        std::operator<<(poVar6,(string *)*ppAVar8);
        if ((*ppAVar8)->single_end == false) {
          std::operator<<(outfile,"|paired");
        }
        std::operator<<(outfile,"|ht_freq:");
        std::ostream::_M_insert<double>((*ppAVar8)->probability);
        poVar6 = std::operator<<(outfile,"|start1:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(outfile,"|end1:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        if ((*ppAVar8)->single_end == false) {
          poVar6 = std::operator<<(outfile,"|start2:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(outfile,"|end2:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        }
        poVar6 = std::operator<<(outfile,"|#reads:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(outfile,"|#strand:");
        std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        std::endl<char,std::char_traits<char>>(outfile);
        operator<<(outfile,&(*ppAVar8)->sequence1);
        pAVar10 = *ppAVar8;
        if (pAVar10->single_end == false) {
          uVar14 = pAVar10->end1;
          while (uVar14 = uVar14 + 1, uVar14 < pAVar10->start2) {
            std::operator<<(outfile,"N");
            pAVar10 = *ppAVar8;
          }
          operator<<(outfile,&pAVar10->sequence2);
        }
        std::endl<char,std::char_traits<char>>(outfile);
        ppAVar8 = ppAVar8 + 1;
        if (ppAVar8 == ppAVar9) {
          ppAVar8 = (_Elt_pointer)local_1b0[1];
          local_1b0 = local_1b0 + 1;
          ppAVar9 = ppAVar8 + 0x40;
        }
      }
      return;
    }
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppAVar9 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1b0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
    local_1a0 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    ppAVar8 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (ppAVar9 != ppAVar8) {
      AlignmentRecord::getReadNames_abi_cxx11_(&local_158,*ppAVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&names,&local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
      poVar6 = std::operator<<(outfile,">");
      std::operator<<(poVar6,(string *)*ppAVar9);
      pAVar10 = *ppAVar9;
      if (pAVar10->single_end == true) {
        std::operator<<(outfile,"|ht_freq:");
        std::ostream::_M_insert<double>((*ppAVar9)->probability);
        poVar6 = std::operator<<(outfile,"|start1:");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(outfile,"|end1:");
LAB_0018fb83:
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      }
      else {
        uVar14 = pAVar10->end1 + 1;
        if (uVar14 < pAVar10->start2) {
          std::operator<<(outfile,"|paired");
          std::operator<<(outfile,"|ht_freq:");
          std::ostream::_M_insert<double>((*ppAVar9)->probability);
          poVar6 = std::operator<<(outfile,"|start1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(outfile,"|end1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(outfile,"|start2:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar11 = "|end2:";
LAB_0018fb76:
          poVar6 = std::operator<<(outfile,pcVar11);
          goto LAB_0018fb83;
        }
        if (uVar14 == pAVar10->start2) {
          std::operator<<(outfile,"|ht_freq:");
          std::ostream::_M_insert<double>((*ppAVar9)->probability);
          poVar6 = std::operator<<(outfile,"|start1:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          pcVar11 = "|end1:";
          goto LAB_0018fb76;
        }
      }
      pbVar3 = names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar16 = 0;
      iVar15 = 0;
      for (pbVar13 = names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b05af);
        if (lVar7 == -1) {
          lVar7 = std::__cxx11::string::find((char *)pbVar13,0x1b05b6);
          iVar15 = iVar15 + (uint)(lVar7 != -1);
        }
        else {
          iVar16 = iVar16 + 1;
        }
      }
      poVar6 = std::operator<<(outfile,"|ht1:");
      std::ostream::operator<<((ostream *)poVar6,iVar16);
      poVar6 = std::operator<<(outfile,"|ht2:");
      std::ostream::operator<<((ostream *)poVar6,iVar15);
      std::endl<char,std::char_traits<char>>(outfile);
      operator<<(outfile,&(*ppAVar9)->sequence1);
      if ((*ppAVar9)->single_end == false) {
        uVar14 = (*ppAVar9)->end1;
        while( true ) {
          uVar14 = uVar14 + 1;
          if ((*ppAVar9)->start2 <= uVar14) break;
          std::operator<<(outfile,"N");
        }
        operator<<(outfile,&(*ppAVar9)->sequence2);
      }
      std::endl<char,std::char_traits<char>>(outfile);
      ppAVar9 = ppAVar9 + 1;
      if (ppAVar9 == local_1b0) {
        ppAVar9 = local_1a0[1];
        local_1a0 = local_1a0 + 1;
        local_1b0 = ppAVar9 + 0x40;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names);
  return;
}

Assistant:

void printReads(std::ostream& outfile, std::deque<AlignmentRecord*>& reads, int doc_haplotypes) {
    auto comp = [](AlignmentRecord* al1, AlignmentRecord* al2) { return al1->probability > al2->probability; };
    std::sort(reads.begin(), reads.end(), comp);

    outfile.precision(5);
    outfile << std::fixed;


    if (doc_haplotypes == 0){
        for (auto&& r : reads) {
            unsigned int abs_number_reads = r->getReadNames().size();
            outfile << ">" <<r->name;
            if (not r->single_end) outfile << "|paired";
            outfile << "|ht_freq:" << r->probability;
            outfile << "|start1:" << r->getStart1();
            outfile << "|end1:" << r->getEnd1();
            if (not r->single_end){
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            outfile << "|#reads:" << abs_number_reads;
            outfile << "|#strand:" << r->isStrand1();
            outfile << endl;

            outfile << r->sequence1;
            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 5) {
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            int haplo3counter = 0;
            int haplo4counter = 0;
            int haplo5counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("mutant1") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant2") != std::string::npos) {
                    haplo2counter++;
                 } else if (i.find("mutant3") != std::string::npos) {
                    haplo3counter++;
                 } else if (i.find("mutant4") != std::string::npos) {
                    haplo4counter++;
                 } else if (i.find("mutant5") != std::string::npos) {
                    haplo5counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << "|ht3:" << haplo3counter;
            outfile << "|ht4:" << haplo4counter;
            outfile << "|ht5:" << haplo5counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    } else if(doc_haplotypes == 2){
        std::vector<std::string> names;
        for (auto&& r : reads) {
            names = r->getReadNames();
            int haplo1counter = 0;
            int haplo2counter = 0;
            outfile << ">" << r->name;

            if(r->single_end){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
            }
            else if(!r->single_end && (r->getEnd1()+1 < r->getStart2())){
                outfile << "|paired";
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd1();
                outfile << "|start2:" << r->getStart2();
                outfile << "|end2:" << r->getEnd2();
            }
            else if (!r->single_end && (r->getEnd1()+1 == r->getStart2())){
                outfile << "|ht_freq:" << r->probability;
                outfile << "|start1:" << r->getStart1();
                outfile << "|end1:" << r->getEnd2();
            }
            for(auto& i: names){
                 if (i.find("normal") != std::string::npos){
                    haplo1counter++;
                 } else if (i.find("mutant") != std::string::npos) {
                    haplo2counter++;
                 }
            }
            outfile << "|ht1:" << haplo1counter;
            outfile << "|ht2:" << haplo2counter;
            outfile << endl;

            outfile << r->sequence1;

            if (not r->single_end) {
                for(unsigned int i = r->end1+1; i < r->start2; i++) {
                    outfile << "N";
                }
                outfile << r->sequence2;
            }
            outfile << endl;
        }
    }
}